

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int grad_calc(custom_function *funcpt,double *x,int N,double *dx,double eps2,double *f)

{
  double *__dest;
  char *__format;
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  __dest = (double *)malloc((long)N * 8);
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar3 = x[uVar2];
      if (ABS(dVar3) < 1.0 / ABS(dx[uVar2])) {
        dVar3 = signx(dVar3);
        dVar3 = dVar3 / ABS(dx[uVar2]);
      }
      memcpy(__dest,x,(ulong)(uint)N * 8);
      __dest[uVar2] = __dest[uVar2] + dVar3 * eps2;
      dVar4 = (*funcpt->funcpt)(__dest,N,funcpt->params);
      dVar5 = (*funcpt->funcpt)(x,N,funcpt->params);
      dVar3 = (dVar4 - dVar5) / (dVar3 * eps2);
      f[uVar2] = dVar3;
      if (1.79769313486232e+308 <= ABS(dVar3)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00141972:
        printf(__format);
        iVar1 = 0xf;
        goto LAB_0014197f;
      }
      if (NAN(dVar3)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00141972;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  iVar1 = 0;
LAB_0014197f:
  free(__dest);
  return iVar1;
}

Assistant:

int grad_calc(custom_function *funcpt, double *x, int N, double *dx, double eps2, double *f) {
	int i, j,retval;
	double step, fd, stepmax;
	double *xi;

	fd = eps2; // square root of macheps
	retval = 0;
	xi = (double*)malloc(sizeof(double)*N);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		}
		else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		step = fd * stepmax;
		for (j = 0; j < N; ++j) {
			xi[j] = x[j];
		}
		xi[i] += step;
		f[i] = (FUNCPT_EVAL(funcpt, xi, N) - FUNCPT_EVAL(funcpt, x, N)) / step;
		if (f[i] >= DBL_MAX || f[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(xi);
			return 15;
		}
		if (f[i] != f[i]) {
			printf("Program Exiting as the function returns NaN");
			free(xi);
			return 15;
		}
		//xi[i] -= step;
	}

	free(xi);
	return retval;

}